

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountError.cpp
# Opt level: O1

string * __thiscall
oout::FmtError::suite
          (string *__return_storage_ptr__,FmtError *this,string *param_1,nanoseconds *param_2,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::
  accumulate<std::_List_const_iterator<std::shared_ptr<oout::Result_const>>,std::__cxx11::string,oout::FmtError::suite(std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>const&)const::_lambda(std::__cxx11::string_const&,auto:1_const&)_1_>
            (__return_storage_ptr__,
             (results->
             super__List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
             )._M_impl._M_node.super__List_node_base._M_next,
             (_List_const_iterator<std::shared_ptr<const_oout::Result>_>)results,&local_30,
             (anon_class_8_1_8991fb9c)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string suite(
		const string &,
		const chrono::nanoseconds &,
		const list<shared_ptr<const Result>> &results
	) const override
	{
		return accumulate(
			results.begin(),
			results.end(),
			string{},
			[this](const string &v, const auto &r){
				return v + r->print(*this);
			}
		);
	}